

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O1

void av1_gop_setup_structure(AV1_COMP *cpi)

{
  int *__s;
  _Bool *p_Var1;
  int iVar2;
  int iVar3;
  AV1_PRIMARY *pAVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  FRAME_TYPE FVar9;
  uint uVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  int *first_frame_index;
  uint uVar14;
  int start;
  bool bVar15;
  int in_stack_ffffffffffffffa8;
  int local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  int parallel_frame_count;
  ulong local_40;
  int local_38;
  int local_34;
  
  pAVar4 = cpi->ppi;
  if ((cpi->rc).frames_since_key == 0) {
    iVar6 = (cpi->oxcf).kf_max_pyr_height;
    if (iVar6 != -1) {
      iVar12 = (pAVar4->gf_group).max_layer_depth_allowed;
      if (iVar6 < iVar12) {
        iVar12 = iVar6;
      }
      (pAVar4->gf_group).max_layer_depth_allowed = iVar12;
    }
    bVar15 = false;
  }
  else {
    bVar15 = (pAVar4->gf_state).arf_gf_boost_lst != 0;
  }
  local_40 = (ulong)(uint)(pAVar4->p_rc).baseline_gf_interval;
  uVar7 = 0;
  local_54 = 0;
  local_50 = 0;
  if (bVar15 != false) {
    uVar7 = (cpi->common).current_frame.frame_number;
  }
  __s = (pAVar4->gf_group).frame_parallel_level;
  local_4c = uVar7;
  memset((pAVar4->gf_group).src_offset,0,1000);
  memset(__s,0,0x5dc);
  iVar12 = 0x3c0f36;
  memset((pAVar4->gf_group).skip_frame_refresh,0xff,9000);
  iVar6 = (int)local_40;
  if (bVar15 == false) {
    bVar11 = 1 < (cpi->oxcf).kf_cfg.enable_keyframe_filtering;
    (pAVar4->gf_group).update_type[0] = (bVar11 && iVar6 != 0xfa) * '\x03';
    (pAVar4->gf_group).arf_src_offset[0] = '\0';
    (pAVar4->gf_group).cur_frame_idx[0] = '\0';
    (pAVar4->gf_group).layer_depth[0] = 0;
    (pAVar4->gf_group).frame_type[0] = '\0';
    (pAVar4->gf_group).refbuf_state[0] = '\0';
    (pAVar4->gf_group).max_layer_depth = 0;
    (pAVar4->gf_group).display_idx[0] = uVar7;
    local_54 = 1;
    if (bVar11 && iVar6 != 0xfa) {
      (pAVar4->gf_group).update_type[1] = '\x04';
      (pAVar4->gf_group).arf_src_offset[1] = '\0';
      (pAVar4->gf_group).cur_frame_idx[1] = '\0';
      (pAVar4->gf_group).layer_depth[1] = 0;
      (pAVar4->gf_group).frame_type[1] = '\x01';
      (pAVar4->gf_group).refbuf_state[1] = '\x01';
      (pAVar4->gf_group).max_layer_depth = 0;
      (pAVar4->gf_group).display_idx[1] = uVar7;
      local_54 = 2;
    }
    local_4c = uVar7 + 1;
    local_50 = 1;
  }
  if (bVar15 == true) {
    lVar5 = (long)local_54;
    (pAVar4->gf_group).update_type[lVar5] = '\x02';
    (pAVar4->gf_group).arf_src_offset[lVar5] = '\0';
    (pAVar4->gf_group).cur_frame_idx[lVar5] = (uchar)local_50;
    (pAVar4->gf_group).layer_depth[lVar5] = 0;
    (pAVar4->gf_group).frame_type[lVar5] = '\x01';
    (pAVar4->gf_group).refbuf_state[lVar5] = '\x01';
    (pAVar4->gf_group).max_layer_depth = 0;
    (pAVar4->gf_group).display_idx[lVar5] = local_4c;
    local_4c = local_4c + 1;
    local_54 = local_54 + 1;
    local_50 = local_50 + 1;
  }
  local_38 = (pAVar4->gf_group).max_layer_depth_allowed;
  local_34 = (cpi->rc).frames_to_fwd_kf;
  iVar2 = (cpi->oxcf).kf_cfg.sframe_dist;
  iVar3 = (cpi->oxcf).kf_cfg.sframe_mode;
  if (0 < iVar2 && 0 < iVar3) {
    if (iVar3 == 2) {
      p_Var1 = &(pAVar4->gf_group).is_sframe_due;
      *p_Var1 = (_Bool)(*p_Var1 | (local_54 != 0 && local_54 % iVar2 == 0));
    }
    else if (iVar3 == 1) {
      (pAVar4->gf_group).is_sframe_due = 0 < local_38;
    }
  }
  start = iVar6 + -1;
  if (local_38 < 1) {
    (pAVar4->gf_group).arf_index = -1;
  }
  else {
    lVar5 = (long)local_54;
    (pAVar4->gf_group).update_type[lVar5] = '\x03';
    (pAVar4->gf_group).arf_src_offset[lVar5] = (char)start - (uchar)local_50;
    (pAVar4->gf_group).cur_frame_idx[lVar5] = (uchar)local_50;
    (pAVar4->gf_group).layer_depth[lVar5] = 1;
    (pAVar4->gf_group).arf_boost[lVar5] = (cpi->ppi->p_rc).gfu_boost;
    if (local_34 == start) {
      FVar9 = '\0';
    }
    else {
      FVar9 = (pAVar4->gf_group).is_sframe_due * '\x02' + '\x01';
    }
    (pAVar4->gf_group).frame_type[lVar5] = FVar9;
    (pAVar4->gf_group).is_sframe_due = (0 < iVar2 && 0 < iVar3) && FVar9 != '\x03';
    (pAVar4->gf_group).refbuf_state[lVar5] = '\x01';
    (pAVar4->gf_group).max_layer_depth = 1;
    (pAVar4->gf_group).arf_index = local_54;
    (pAVar4->gf_group).display_idx[lVar5] = (pAVar4->gf_group).arf_src_offset[lVar5] + local_4c;
    local_54 = local_54 + 1;
  }
  parallel_frame_count = 1;
  uVar7 = cpi->ppi->num_fp_contexts;
  if ((int)uVar7 < 2 || local_38 < 1) {
    bVar11 = false;
  }
  else {
    bVar11 = 3 < (pAVar4->gf_group).max_layer_depth_allowed;
  }
  uVar14 = (uint)bVar11;
  local_48 = local_50;
  if (bVar11 == false) {
    set_multi_layer_params
              (&pAVar4->twopass,&cpi->twopass_frame,&pAVar4->gf_group,&pAVar4->p_rc,
               (RATE_CONTROL *)&cpi->frame_info,(FRAME_INFO *)(ulong)local_50,start,(int)&local_50,
               &local_54,&parallel_frame_count,(int *)(ulong)uVar7,uVar14,(int)&local_48,
               (int *)&local_4c,(int *)(ulong)((0 < local_38) + 1),iVar12);
  }
  else {
    if (!bVar15) {
      iVar6 = start;
    }
    uVar10 = 0x7fffffff;
    if (iVar6 == 0x20) {
      uVar10 = 4;
    }
    first_frame_index = (int *)0x3;
    if (iVar6 != 0x10) {
      first_frame_index = (int *)(ulong)uVar10;
    }
    set_multi_layer_params_for_fp
              (&pAVar4->twopass,&cpi->twopass_frame,&pAVar4->gf_group,&pAVar4->p_rc,
               (RATE_CONTROL *)&cpi->frame_info,(FRAME_INFO *)(ulong)local_50,start,(int)&local_50,
               &local_54,&parallel_frame_count,(int *)(ulong)uVar7,uVar14,(int)&local_48,
               first_frame_index,(int)&local_4c,(int *)(ulong)((0 < local_38) + 1),
               in_stack_ffffffffffffffa8);
  }
  if (local_38 < 1) {
    if ((int)local_50 < (int)local_40) {
      uVar13 = (ulong)local_48;
      lVar5 = (long)local_54;
      lVar8 = 0;
      do {
        (pAVar4->gf_group).update_type[lVar8 + lVar5] = '\x01';
        (pAVar4->gf_group).arf_src_offset[lVar8 + lVar5] = '\0';
        (pAVar4->gf_group).cur_frame_idx[lVar8 + lVar5] = (uchar)((ulong)local_50 + lVar8);
        (pAVar4->gf_group).layer_depth[lVar5 + lVar8] = 6;
        (pAVar4->gf_group).arf_boost[lVar5 + lVar8] = 100;
        (pAVar4->gf_group).frame_type[lVar8 + lVar5] = '\x01';
        (pAVar4->gf_group).refbuf_state[lVar8 + lVar5] = '\x01';
        iVar6 = (pAVar4->gf_group).max_layer_depth;
        if (iVar6 < 3) {
          iVar6 = 2;
        }
        (pAVar4->gf_group).max_layer_depth = iVar6;
        iVar6 = (pAVar4->gf_group).frame_parallel_level[lVar5 + lVar8];
        if (0 < iVar6) {
          if (iVar6 == 1) {
            uVar13 = (ulong)local_50 + lVar8 & 0xffffffff;
          }
          (pAVar4->gf_group).src_offset[lVar5 + lVar8] =
               ((uint)(pAVar4->gf_group).arf_src_offset[lVar8 + lVar5] - (int)uVar13) + local_50 +
               (int)lVar8;
        }
        (pAVar4->gf_group).display_idx[lVar5 + lVar8] = local_4c + (int)lVar8;
        lVar8 = lVar8 + 1;
      } while ((local_50 - (int)local_40) + (int)lVar8 != 0);
      local_54 = local_54 + (int)lVar8;
    }
  }
  else {
    lVar5 = (long)local_54;
    (pAVar4->gf_group).update_type[lVar5] = '\x04';
    (pAVar4->gf_group).arf_src_offset[lVar5] = '\0';
    (pAVar4->gf_group).cur_frame_idx[lVar5] = (uchar)local_50;
    (pAVar4->gf_group).layer_depth[lVar5] = 6;
    (pAVar4->gf_group).arf_boost[lVar5] = 100;
    (pAVar4->gf_group).frame_type[lVar5] = '\x01';
    (pAVar4->gf_group).refbuf_state[lVar5] = local_34 != start;
    (pAVar4->gf_group).display_idx[lVar5] = local_4c;
    local_54 = local_54 + 1;
  }
  if (uVar14 != 0) {
    lVar5 = (long)local_54;
    if (0 < lVar5) {
      iVar6 = 0x7fffffff;
      lVar8 = 0;
      iVar12 = 0;
      do {
        if (__s[lVar8] == 1) {
          if ((iVar6 != 0x7fffffff) && (iVar12 == 0)) {
            __s[iVar6] = 0;
          }
          iVar12 = 0;
          iVar6 = (int)lVar8;
        }
        iVar12 = iVar12 + (uint)(__s[lVar8] == 2);
        lVar8 = lVar8 + 1;
      } while (lVar5 != lVar8);
    }
    if ((pAVar4->gf_group).frame_parallel_level[lVar5 + -2] == 1) {
      __s[lVar5 + -2] = 0;
    }
  }
  lVar5 = (long)local_54;
  if (lVar5 < 0xfa) {
    do {
      (pAVar4->gf_group).update_type[lVar5] = '\x01';
      (pAVar4->gf_group).arf_src_offset[lVar5] = '\0';
      (pAVar4->gf_group).cur_frame_idx[lVar5] = (uchar)lVar5;
      (pAVar4->gf_group).layer_depth[lVar5] = 6;
      (pAVar4->gf_group).arf_boost[lVar5] = 100;
      (pAVar4->gf_group).frame_type[lVar5] = '\x01';
      (pAVar4->gf_group).refbuf_state[lVar5] = '\x01';
      iVar6 = (pAVar4->gf_group).max_layer_depth;
      if (iVar6 < 3) {
        iVar6 = 2;
      }
      (pAVar4->gf_group).max_layer_depth = iVar6;
      lVar5 = lVar5 + 1;
    } while ((int)lVar5 != 0xfa);
  }
  (pAVar4->gf_group).size = local_54;
  if ((pAVar4->gf_group).max_layer_depth_allowed == 0) {
    uVar7 = 0xffffffff;
    do {
      uVar7 = uVar7 + 1;
    } while (1 << ((byte)uVar7 & 0x1f) < (pAVar4->p_rc).baseline_gf_interval);
    if (0 < (pAVar4->gf_group).size) {
      lVar5 = 0;
      do {
        uVar14 = 0;
        do {
          if (((uint)lVar5 >> (uVar14 & 0x1f) & 1) != 0) goto LAB_003c1567;
          uVar14 = uVar14 + 1;
        } while (uVar14 != 6);
        uVar14 = 6;
LAB_003c1567:
        iVar6 = uVar7 - uVar14;
        if ((int)(uVar7 - uVar14) < 1) {
          iVar6 = 0;
        }
        (pAVar4->gf_group).layer_depth[lVar5] = iVar6;
        lVar5 = lVar5 + 1;
      } while (lVar5 < (pAVar4->gf_group).size);
    }
    uVar14 = 6;
    if (uVar7 < 6) {
      uVar14 = uVar7;
    }
    (pAVar4->gf_group).max_layer_depth = uVar14;
  }
  return;
}

Assistant:

void av1_gop_setup_structure(AV1_COMP *cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  const int key_frame = rc->frames_since_key == 0;
  FRAME_UPDATE_TYPE first_frame_update_type = ARF_UPDATE;

  if (key_frame) {
    first_frame_update_type = KF_UPDATE;
    if (cpi->oxcf.kf_max_pyr_height != -1) {
      gf_group->max_layer_depth_allowed = AOMMIN(
          cpi->oxcf.kf_max_pyr_height, gf_group->max_layer_depth_allowed);
    }
  } else if (!cpi->ppi->gf_state.arf_gf_boost_lst) {
    first_frame_update_type = GF_UPDATE;
  }

  gf_group->size = construct_multi_layer_gf_structure(
      cpi, twopass, gf_group, rc, frame_info, p_rc->baseline_gf_interval,
      first_frame_update_type);

  if (gf_group->max_layer_depth_allowed == 0)
    set_ld_layer_depth(gf_group, p_rc->baseline_gf_interval);
}